

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor_function.hpp
# Opt level: O1

void __thiscall
asio::detail::executor_function::
executor_function<asio::detail::binder0<asio::detail::binder1<std::function<void(std::error_code_const&)>,std::error_code>>,std::allocator<void>>
          (executor_function *this,
          binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>
          *f,allocator<void> *a)

{
  _func_void_impl_base_ptr_bool *p_Var1;
  error_category *peVar2;
  long *plVar3;
  impl_base *piVar4;
  undefined8 uVar5;
  ptr p;
  ptr local_28;
  
  local_28.a = a;
  plVar3 = (long *)__tls_get_addr(&PTR_0057ce40);
  if (*plVar3 == 0) {
    uVar5 = 0;
  }
  else {
    uVar5 = *(undefined8 *)(*plVar3 + 8);
  }
  piVar4 = (impl_base *)
           thread_info_base::allocate<asio::detail::thread_info_base::executor_function_tag>
                     (uVar5,0x40,8);
  local_28.p = (impl<asio::detail::binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>,_std::allocator<void>_>
                *)0x0;
  piVar4[1].complete_ = (_func_void_impl_base_ptr_bool *)0x0;
  piVar4[2].complete_ = (_func_void_impl_base_ptr_bool *)0x0;
  piVar4[3].complete_ = (_func_void_impl_base_ptr_bool *)0x0;
  piVar4[4].complete_ = (_func_void_impl_base_ptr_bool *)(f->handler_).handler_._M_invoker;
  if ((f->handler_).handler_.super__Function_base._M_manager != (_Manager_type)0x0) {
    p_Var1 = *(_func_void_impl_base_ptr_bool **)
              ((long)&(f->handler_).handler_.super__Function_base._M_functor + 8);
    piVar4[1].complete_ =
         *(_func_void_impl_base_ptr_bool **)&(f->handler_).handler_.super__Function_base._M_functor;
    piVar4[2].complete_ = p_Var1;
    piVar4[3].complete_ =
         (_func_void_impl_base_ptr_bool *)(f->handler_).handler_.super__Function_base._M_manager;
    (f->handler_).handler_.super__Function_base._M_manager = (_Manager_type)0x0;
    (f->handler_).handler_._M_invoker = (_Invoker_type)0x0;
  }
  peVar2 = (f->handler_).arg1_._M_cat;
  piVar4[5].complete_ = *(_func_void_impl_base_ptr_bool **)&(f->handler_).arg1_;
  piVar4[6].complete_ = (_func_void_impl_base_ptr_bool *)peVar2;
  piVar4->complete_ =
       complete<asio::detail::binder0<asio::detail::binder1<std::function<void(std::error_code_const&)>,std::error_code>>,std::allocator<void>>
  ;
  this->impl_ = piVar4;
  local_28.v = (void *)0x0;
  impl<asio::detail::binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>,_std::allocator<void>_>
  ::ptr::reset(&local_28);
  return;
}

Assistant:

explicit executor_function(F f, const Alloc& a)
  {
    // Allocate and construct an object to wrap the function.
    typedef impl<F, Alloc> impl_type;
    typename impl_type::ptr p = {
      detail::addressof(a), impl_type::ptr::allocate(a), 0 };
    impl_ = new (p.v) impl_type(static_cast<F&&>(f), a);
    p.v = 0;
  }